

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersector1<4,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::ObjectIntersector1<false>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Geometry *this;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 (*pauVar11) [16];
  byte bVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  byte bVar19;
  undefined4 uVar20;
  ulong unaff_R15;
  size_t mask;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1048 [8];
  float fStack_1040;
  float fStack_103c;
  ulong local_1038;
  undefined1 (*local_1030) [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  undefined1 local_ff8 [16];
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  undefined1 local_f78 [8];
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_f78 = (undefined1  [8])*(undefined8 *)&This->ptr[1].bounds.bounds0.lower.field_0;
  uStack_f70 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar31 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar1 = (context->query_radius).field_0;
    auVar22 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
    auVar31 = ZEXT1664(auVar22);
  }
  local_1030 = (undefined1 (*) [16])local_f68;
  uVar20 = *(undefined4 *)&(query->p).field_0;
  local_fa8._4_4_ = uVar20;
  local_fa8._0_4_ = uVar20;
  local_fa8._8_4_ = uVar20;
  local_fa8._12_4_ = uVar20;
  auVar29 = ZEXT1664(local_fa8);
  uVar20 = *(undefined4 *)((long)&(query->p).field_0 + 4);
  local_fb8._4_4_ = uVar20;
  local_fb8._0_4_ = uVar20;
  local_fb8._8_4_ = uVar20;
  local_fb8._12_4_ = uVar20;
  auVar30 = ZEXT1664(local_fb8);
  uVar20 = *(undefined4 *)((long)&(query->p).field_0 + 8);
  local_fc8._4_4_ = uVar20;
  local_fc8._0_4_ = uVar20;
  local_fc8._8_4_ = uVar20;
  local_fc8._12_4_ = uVar20;
  auVar32 = ZEXT1664(local_fc8);
  uVar20 = *(undefined4 *)&(context->query_radius).field_0;
  auVar22._4_4_ = uVar20;
  auVar22._0_4_ = uVar20;
  auVar22._8_4_ = uVar20;
  auVar22._12_4_ = uVar20;
  uVar20 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar24._4_4_ = uVar20;
  auVar24._0_4_ = uVar20;
  auVar24._8_4_ = uVar20;
  auVar24._12_4_ = uVar20;
  uVar20 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar26._4_4_ = uVar20;
  auVar26._0_4_ = uVar20;
  auVar26._8_4_ = uVar20;
  auVar26._12_4_ = uVar20;
  bVar14 = false;
  local_1038 = unaff_R15;
  do {
    local_fd8 = vsubps_avx(auVar29._0_16_,auVar22);
    fVar5 = auVar22._0_4_;
    fVar6 = auVar22._4_4_;
    fVar7 = auVar22._8_4_;
    fVar8 = auVar22._12_4_;
    local_fe8 = auVar29._0_4_ + fVar5;
    fStack_fe4 = auVar29._4_4_ + fVar6;
    fStack_fe0 = auVar29._8_4_ + fVar7;
    fStack_fdc = auVar29._12_4_ + fVar8;
    local_ff8 = vsubps_avx(auVar30._0_16_,auVar24);
    local_1008 = auVar30._0_4_ + auVar24._0_4_;
    fStack_1004 = auVar30._4_4_ + auVar24._4_4_;
    fStack_1000 = auVar30._8_4_ + auVar24._8_4_;
    fStack_ffc = auVar30._12_4_ + auVar24._12_4_;
    local_1018 = vsubps_avx(auVar32._0_16_,auVar26);
    local_1028._0_4_ = auVar32._0_4_ + auVar26._0_4_;
    local_1028._4_4_ = auVar32._4_4_ + auVar26._4_4_;
    local_1028._8_4_ = auVar32._8_4_ + auVar26._8_4_;
    local_1028._12_4_ = auVar32._12_4_ + auVar26._12_4_;
    local_f98._0_4_ = fVar5 * fVar5;
    local_f98._4_4_ = fVar6 * fVar6;
    local_f98._8_4_ = fVar7 * fVar7;
    local_f98._12_4_ = fVar8 * fVar8;
    auVar33 = ZEXT1664(local_f98);
    local_f88 = auVar31._0_16_;
    do {
      do {
        do {
          if (local_1030 == (undefined1 (*) [16])local_f78) {
            return bVar14;
          }
          pauVar11 = local_1030 + -1;
          local_1030 = local_1030 + -1;
        } while (auVar31._0_4_ < *(float *)(*pauVar11 + 8));
        uVar17 = *(ulong *)*local_1030;
        do {
          auVar22 = auVar29._0_16_;
          auVar24 = auVar30._0_16_;
          auVar26 = auVar32._0_16_;
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar17 & 8) == 0) {
              auVar9 = vmaxps_avx(auVar22,*(undefined1 (*) [16])(uVar17 + 0x20));
              auVar9 = vminps_avx(auVar9,*(undefined1 (*) [16])(uVar17 + 0x30));
              auVar23 = vsubps_avx(auVar9,auVar22);
              auVar22 = vmaxps_avx(auVar24,*(undefined1 (*) [16])(uVar17 + 0x40));
              auVar9 = vminps_avx(auVar22,*(undefined1 (*) [16])(uVar17 + 0x50));
              auVar22 = vmaxps_avx(auVar26,*(undefined1 (*) [16])(uVar17 + 0x60));
              auVar22 = vminps_avx(auVar22,*(undefined1 (*) [16])(uVar17 + 0x70));
              auVar24 = vsubps_avx(auVar9,auVar24);
              auVar22 = vsubps_avx(auVar22,auVar26);
              local_1048._0_4_ =
                   auVar23._0_4_ * auVar23._0_4_ + auVar24._0_4_ * auVar24._0_4_ +
                   auVar22._0_4_ * auVar22._0_4_;
              local_1048._4_4_ =
                   auVar23._4_4_ * auVar23._4_4_ + auVar24._4_4_ * auVar24._4_4_ +
                   auVar22._4_4_ * auVar22._4_4_;
              fStack_1040 = auVar23._8_4_ * auVar23._8_4_ + auVar24._8_4_ * auVar24._8_4_ +
                            auVar22._8_4_ * auVar22._8_4_;
              fStack_103c = auVar23._12_4_ * auVar23._12_4_ + auVar24._12_4_ * auVar24._12_4_ +
                            auVar22._12_4_ * auVar22._12_4_;
              auVar22 = vcmpps_avx(_local_1048,auVar33._0_16_,2);
              auVar24 = vcmpps_avx(*(undefined1 (*) [16])(uVar17 + 0x20),
                                   *(undefined1 (*) [16])(uVar17 + 0x30),2);
              auVar22 = vandps_avx(auVar22,auVar24);
LAB_012c144c:
              uVar20 = vmovmskps_avx(auVar22);
              local_1038 = CONCAT44((int)(local_1038 >> 0x20),uVar20);
            }
          }
          else if ((uVar17 & 8) == 0) {
            auVar9 = *(undefined1 (*) [16])(uVar17 + 0x20);
            auVar23 = *(undefined1 (*) [16])(uVar17 + 0x30);
            auVar10 = vmaxps_avx(auVar22,auVar9);
            auVar10 = vminps_avx(auVar10,auVar23);
            auVar10 = vsubps_avx(auVar10,auVar22);
            auVar22 = vmaxps_avx(auVar24,*(undefined1 (*) [16])(uVar17 + 0x40));
            auVar22 = vminps_avx(auVar22,*(undefined1 (*) [16])(uVar17 + 0x50));
            auVar24 = vsubps_avx(auVar22,auVar24);
            auVar22 = vmaxps_avx(auVar26,*(undefined1 (*) [16])(uVar17 + 0x60));
            auVar22 = vminps_avx(auVar22,*(undefined1 (*) [16])(uVar17 + 0x70));
            auVar22 = vsubps_avx(auVar22,auVar26);
            local_1048._4_4_ =
                 auVar10._4_4_ * auVar10._4_4_ + auVar24._4_4_ * auVar24._4_4_ +
                 auVar22._4_4_ * auVar22._4_4_;
            local_1048._0_4_ =
                 auVar10._0_4_ * auVar10._0_4_ + auVar24._0_4_ * auVar24._0_4_ +
                 auVar22._0_4_ * auVar22._0_4_;
            fStack_1040 = auVar10._8_4_ * auVar10._8_4_ + auVar24._8_4_ * auVar24._8_4_ +
                          auVar22._8_4_ * auVar22._8_4_;
            fStack_103c = auVar10._12_4_ * auVar10._12_4_ + auVar24._12_4_ * auVar24._12_4_ +
                          auVar22._12_4_ * auVar22._12_4_;
            auVar22 = vcmpps_avx(auVar9,auVar23,2);
            auVar24 = vcmpps_avx(*(undefined1 (*) [16])(uVar17 + 0x50),local_ff8,5);
            auVar22 = vandps_avx(auVar22,auVar24);
            auVar10._4_4_ = fStack_fe4;
            auVar10._0_4_ = local_fe8;
            auVar10._8_4_ = fStack_fe0;
            auVar10._12_4_ = fStack_fdc;
            auVar24 = vcmpps_avx(auVar9,auVar10,2);
            auVar9._4_4_ = fStack_1004;
            auVar9._0_4_ = local_1008;
            auVar9._8_4_ = fStack_1000;
            auVar9._12_4_ = fStack_ffc;
            auVar26 = vcmpps_avx(*(undefined1 (*) [16])(uVar17 + 0x40),auVar9,2);
            auVar24 = vandps_avx(auVar26,auVar24);
            auVar26 = vcmpps_avx(*(undefined1 (*) [16])(uVar17 + 0x70),local_1018,5);
            auVar22 = vandps_avx(auVar22,auVar26);
            auVar26 = vcmpps_avx(auVar23,local_fd8,5);
            auVar9 = vcmpps_avx(*(undefined1 (*) [16])(uVar17 + 0x60),local_1028,2);
            auVar26 = vandps_avx(auVar9,auVar26);
            auVar24 = vandps_avx(auVar24,auVar26);
            auVar22 = vandps_avx(auVar24,auVar22);
            auVar22 = vpslld_avx(auVar22,0x1f);
            goto LAB_012c144c;
          }
          if ((uVar17 & 8) == 0) {
            if (local_1038 == 0) {
              iVar15 = 4;
            }
            else {
              uVar16 = uVar17 & 0xfffffffffffffff0;
              lVar21 = 0;
              if (local_1038 != 0) {
                for (; (local_1038 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                }
              }
              iVar15 = 0;
              uVar17 = *(ulong *)(uVar16 + lVar21 * 8);
              uVar18 = local_1038 - 1 & local_1038;
              if (uVar18 != 0) {
                uVar3 = *(uint *)(local_1048 + lVar21 * 4);
                lVar21 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                  }
                }
                uVar4 = *(ulong *)(uVar16 + lVar21 * 8);
                uVar2 = *(uint *)(local_1048 + lVar21 * 4);
                uVar18 = uVar18 - 1 & uVar18;
                if (uVar18 == 0) {
                  if (uVar3 < uVar2) {
                    *(ulong *)*local_1030 = uVar4;
                    *(uint *)(*local_1030 + 8) = uVar2;
                    local_1030 = local_1030 + 1;
                  }
                  else {
                    *(ulong *)*local_1030 = uVar17;
                    *(uint *)(*local_1030 + 8) = uVar3;
                    local_1030 = local_1030 + 1;
                    uVar17 = uVar4;
                  }
                }
                else {
                  auVar23._8_8_ = 0;
                  auVar23._0_8_ = uVar17;
                  auVar22 = vpunpcklqdq_avx(auVar23,ZEXT416(uVar3));
                  auVar25._8_8_ = 0;
                  auVar25._0_8_ = uVar4;
                  auVar24 = vpunpcklqdq_avx(auVar25,ZEXT416(uVar2));
                  lVar21 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                    }
                  }
                  auVar27._8_8_ = 0;
                  auVar27._0_8_ = *(ulong *)(uVar16 + lVar21 * 8);
                  auVar9 = vpunpcklqdq_avx(auVar27,ZEXT416(*(uint *)(local_1048 + lVar21 * 4)));
                  auVar26 = vpcmpgtd_avx(auVar24,auVar22);
                  uVar18 = uVar18 - 1 & uVar18;
                  if (uVar18 == 0) {
                    auVar23 = vpshufd_avx(auVar26,0xaa);
                    auVar26 = vblendvps_avx(auVar24,auVar22,auVar23);
                    auVar22 = vblendvps_avx(auVar22,auVar24,auVar23);
                    auVar24 = vpcmpgtd_avx(auVar9,auVar26);
                    auVar23 = vpshufd_avx(auVar24,0xaa);
                    auVar24 = vblendvps_avx(auVar9,auVar26,auVar23);
                    auVar26 = vblendvps_avx(auVar26,auVar9,auVar23);
                    auVar9 = vpcmpgtd_avx(auVar26,auVar22);
                    auVar23 = vpshufd_avx(auVar9,0xaa);
                    auVar9 = vblendvps_avx(auVar26,auVar22,auVar23);
                    auVar22 = vblendvps_avx(auVar22,auVar26,auVar23);
                    *local_1030 = auVar22;
                    local_1030[1] = auVar9;
                    local_1030 = local_1030 + 2;
                    uVar17 = auVar24._0_8_;
                  }
                  else {
                    lVar21 = 0;
                    if (uVar18 != 0) {
                      for (; (uVar18 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                      }
                    }
                    auVar28._8_8_ = 0;
                    auVar28._0_8_ = *(ulong *)(uVar16 + lVar21 * 8);
                    auVar10 = vpunpcklqdq_avx(auVar28,ZEXT416(*(uint *)(local_1048 + lVar21 * 4)));
                    auVar23 = vpshufd_avx(auVar26,0xaa);
                    auVar26 = vblendvps_avx(auVar24,auVar22,auVar23);
                    auVar22 = vblendvps_avx(auVar22,auVar24,auVar23);
                    auVar24 = vpcmpgtd_avx(auVar10,auVar9);
                    auVar23 = vpshufd_avx(auVar24,0xaa);
                    auVar24 = vblendvps_avx(auVar10,auVar9,auVar23);
                    auVar9 = vblendvps_avx(auVar9,auVar10,auVar23);
                    auVar23 = vpcmpgtd_avx(auVar9,auVar22);
                    auVar10 = vpshufd_avx(auVar23,0xaa);
                    auVar23 = vblendvps_avx(auVar9,auVar22,auVar10);
                    auVar22 = vblendvps_avx(auVar22,auVar9,auVar10);
                    auVar9 = vpcmpgtd_avx(auVar24,auVar26);
                    auVar10 = vpshufd_avx(auVar9,0xaa);
                    auVar9 = vblendvps_avx(auVar24,auVar26,auVar10);
                    auVar24 = vblendvps_avx(auVar26,auVar24,auVar10);
                    auVar26 = vpcmpgtd_avx(auVar23,auVar24);
                    auVar10 = vpshufd_avx(auVar26,0xaa);
                    auVar26 = vblendvps_avx(auVar23,auVar24,auVar10);
                    auVar24 = vblendvps_avx(auVar24,auVar23,auVar10);
                    *local_1030 = auVar22;
                    local_1030[1] = auVar24;
                    local_1030[2] = auVar26;
                    local_1030 = local_1030 + 3;
                    uVar17 = auVar9._0_8_;
                    iVar15 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar15 = 6;
          }
        } while (iVar15 == 0);
      } while ((iVar15 != 6) || (uVar16 = (ulong)((uint)uVar17 & 0xf), uVar16 == 8));
      lVar21 = 0;
      bVar12 = 0;
      do {
        bVar19 = bVar12;
        uVar3 = *(uint *)((uVar17 & 0xfffffffffffffff0) + lVar21 * 8);
        this = (context->scene->geometries).items[uVar3].ptr;
        context->geomID = uVar3;
        context->primID = *(uint *)((uVar17 & 0xfffffffffffffff0) + 4 + lVar21 * 8);
        bVar13 = Geometry::pointQuery(this,query,context);
        lVar21 = lVar21 + 1;
        bVar12 = bVar19 | bVar13;
      } while (uVar16 - 8 != lVar21);
      auVar29 = ZEXT1664(local_fa8);
      auVar30 = ZEXT1664(local_fb8);
      auVar31 = ZEXT1664(local_f88);
      auVar32 = ZEXT1664(local_fc8);
      auVar33 = ZEXT1664(local_f98);
    } while (bVar19 == 0 && !bVar13);
    uVar20 = *(undefined4 *)&(context->query_radius).field_0;
    auVar22._4_4_ = uVar20;
    auVar22._0_4_ = uVar20;
    auVar22._8_4_ = uVar20;
    auVar22._12_4_ = uVar20;
    uVar20 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar24._4_4_ = uVar20;
    auVar24._0_4_ = uVar20;
    auVar24._8_4_ = uVar20;
    auVar24._12_4_ = uVar20;
    uVar20 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar26._4_4_ = uVar20;
    auVar26._0_4_ = uVar20;
    auVar26._8_4_ = uVar20;
    auVar26._12_4_ = uVar20;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar31 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar1 = (context->query_radius).field_0;
      auVar9 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
      auVar31 = ZEXT1664(auVar9);
    }
    bVar14 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }